

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

range_type * __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_s...r,cppcms::impl::process_settings::process_memory>>>,cppcms::impl::process_settings::process_memory>>
::
get<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>>
          (basic_map<_d0c7d56a_> *this,
          basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
          *k)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  string_hash *in_RSI;
  vector<_8fa62532_> *in_RDI;
  size_t h;
  string_hash hf;
  basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
  *in_stack_ffffffffffffffe8;
  
  sVar1 = string_hash::operator()(in_RSI,in_stack_ffffffffffffffe8);
  sVar2 = std::vector<$8fa62532$>::size(in_RDI);
  pvVar3 = std::vector<$8fa62532$>::operator[](in_RDI,sVar1 % sVar2);
  return pvVar3;
}

Assistant:

range_type &get(Kt const &k)
	{
		Hash hf;
		size_t h = hf(k) % hash_.size();
		return hash_[h];
	}